

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O2

void dscal(int n,double sa,double *x,int incx)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  bool bVar5;
  
  if (0 < n) {
    if (incx == 1) {
      for (uVar3 = 0; (ulong)(uint)n % 5 != uVar3; uVar3 = uVar3 + 1) {
        x[uVar3] = x[uVar3] * sa;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = CONCAT44(0,n);
      pdVar4 = x + SUB168(auVar1 / ZEXT816(5),0) * -5 + CONCAT44(0,n) + 4;
      for (iVar2 = n + SUB164(auVar1 / ZEXT816(5),0) * -5; iVar2 < n; iVar2 = iVar2 + 5) {
        pdVar4[-4] = pdVar4[-4] * sa;
        pdVar4[-3] = pdVar4[-3] * sa;
        pdVar4[-2] = pdVar4[-2] * sa;
        pdVar4[-1] = pdVar4[-1] * sa;
        *pdVar4 = *pdVar4 * sa;
        pdVar4 = pdVar4 + 5;
      }
    }
    else {
      pdVar4 = x + (incx >> 0x1f & (1 - n) * incx);
      while (bVar5 = n != 0, n = n + -1, bVar5) {
        *pdVar4 = *pdVar4 * sa;
        pdVar4 = pdVar4 + incx;
      }
    }
  }
  return;
}

Assistant:

void dscal ( int n, double sa, double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DSCAL scales a vector by a constant.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double SA, the multiplier.
//
//    Input/output, double X[*], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of X.
//
{
  int i;
  int ix;
  int m;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 )
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      x[i] = sa * x[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      x[i]   = sa * x[i];
      x[i+1] = sa * x[i+1];
      x[i+2] = sa * x[i+2];
      x[i+3] = sa * x[i+3];
      x[i+4] = sa * x[i+4];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    for ( i = 0; i < n; i++ )
    {
      x[ix] = sa * x[ix];
      ix = ix + incx;
    }

  }

  return;
}